

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::IOException::IOException<unsigned_long,unsigned_long,unsigned_long,std::__cxx11::string>
          (IOException *this,string *msg,unsigned_long params,unsigned_long params_1,
          unsigned_long params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  string local_70;
  string local_50 [32];
  
  ::std::__cxx11::string::string(local_50,(string *)params_3);
  Exception::ConstructMessage<unsigned_long,unsigned_long,unsigned_long,std::__cxx11::string>
            (&local_70,(Exception *)msg,(string *)params,params_1,params_2,(unsigned_long)local_50,
             in_stack_ffffffffffffff88);
  IOException(this,(string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

explicit IOException(const string &msg, ARGS... params) : IOException(ConstructMessage(msg, params...)) {
	}